

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

bitarr_address_t middle_find(middle_t *middle,uint32 word,node_range_t *range)

{
  uint8 uVar1;
  uint32 uVar2;
  bitarr_address_t bVar3;
  bitarr_address_t address_00;
  bitarr_address_t address_01;
  uint32 local_3c;
  node_range_t *pnStack_38;
  uint32 at_pointer;
  node_range_t *range_local;
  middle_t *pmStack_28;
  uint32 word_local;
  middle_t *middle_local;
  bitarr_address_t address;
  
  pnStack_38 = range;
  range_local._4_4_ = word;
  pmStack_28 = middle;
  uVar1 = uniform_find((middle->base).base,(middle->base).total_bits,(middle->base).word_bits,
                       (middle->base).word_mask,range->begin - 1,0,range->end,
                       (middle->base).max_vocab,word,&local_3c);
  if (uVar1 == '\0') {
    middle_local = (middle_t *)0x0;
    address.base._0_4_ = 0;
  }
  else {
    middle_local = (middle_t *)(pmStack_28->base).base;
    local_3c = (uint)(pmStack_28->base).word_bits + (pmStack_28->base).total_bits * local_3c;
    address.base._0_4_ = local_3c + pmStack_28->quant_bits;
    address_00.offset = (uint32)address.base;
    address_00.base = middle_local;
    address_00._12_4_ = 0;
    uVar2 = bitarr_read_int25(address_00,(pmStack_28->next_mask).bits,(pmStack_28->next_mask).mask);
    pnStack_38->begin = uVar2;
    address.base._0_4_ = (pmStack_28->base).total_bits + (uint32)address.base;
    address_01.offset = (uint32)address.base;
    address_01.base = middle_local;
    address_01._12_4_ = 0;
    uVar2 = bitarr_read_int25(address_01,(pmStack_28->next_mask).bits,(pmStack_28->next_mask).mask);
    pnStack_38->end = uVar2;
    address.base._0_4_ = local_3c;
  }
  bVar3.offset = (uint32)address.base;
  bVar3.base = middle_local;
  bVar3._12_4_ = 0;
  return bVar3;
}

Assistant:

static bitarr_address_t
middle_find(middle_t * middle, uint32 word, node_range_t * range)
{
    uint32 at_pointer;
    bitarr_address_t address;

    /* finding BitPacked with uniform find */
    if (!uniform_find
        ((void *) middle->base.base, middle->base.total_bits,
         middle->base.word_bits, middle->base.word_mask, range->begin - 1,
         0, range->end, middle->base.max_vocab, word, &at_pointer)) {
        address.base = NULL;
        address.offset = 0;
        return address;
    }

    address.base = middle->base.base;
    at_pointer *= middle->base.total_bits;
    at_pointer += middle->base.word_bits;
    address.offset = at_pointer + middle->quant_bits;
    range->begin =
        bitarr_read_int25(address, middle->next_mask.bits,
                          middle->next_mask.mask);
    address.offset += middle->base.total_bits;
    range->end =
        bitarr_read_int25(address, middle->next_mask.bits,
                          middle->next_mask.mask);
    address.offset = at_pointer;

    return address;
}